

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

int __thiscall glcts::LayoutBindingBaseCase::maxBindings(LayoutBindingBaseCase *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar3;
  int units;
  int local_1c;
  
  local_1c = 0;
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  iVar1 = *(int *)(CONCAT44(extraout_var,iVar1) + 8);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar3 = 0x8b4d;
  if (iVar1 == 2) {
    uVar3 = 0x8f38;
  }
  (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x868))(uVar3,&local_1c);
  return local_1c;
}

Assistant:

virtual int maxBindings()
	{
		int units = 0;

		if (getTestParameters().surface_type == Image)
		{
			gl().getIntegerv(GL_MAX_IMAGE_UNITS, &units);
		}
		else
		{
			gl().getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &units);
		}

		return units;
	}